

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_B_ParamSet.c
# Opt level: O0

void fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_inv(uint64_t *output,uint64_t *t1)

{
  fe_t_conflict t25;
  fe_t_conflict t23;
  fe_t_conflict acc;
  int i;
  uint64_t *in_stack_000004f8;
  uint64_t *in_stack_00000500;
  uint64_t *in_stack_00000508;
  uint64_t *in_stack_00000510;
  undefined4 local_14;
  
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(in_stack_00000500,in_stack_000004f8);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul
            (in_stack_00000510,in_stack_00000508,in_stack_00000500);
  for (local_14 = 0; local_14 < 9; local_14 = local_14 + 1) {
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul
              (in_stack_00000510,in_stack_00000508,in_stack_00000500);
  }
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul
            (in_stack_00000510,in_stack_00000508,in_stack_00000500);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul
            (in_stack_00000510,in_stack_00000508,in_stack_00000500);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(in_stack_00000500,in_stack_000004f8);
  for (local_14 = 0; local_14 < 0xf7; local_14 = local_14 + 1) {
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(in_stack_00000500,in_stack_000004f8);
  }
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul
            (in_stack_00000510,in_stack_00000508,in_stack_00000500);
  for (local_14 = 0; local_14 < 7; local_14 = local_14 + 1) {
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(in_stack_00000500,in_stack_000004f8);
  }
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul
            (in_stack_00000510,in_stack_00000508,in_stack_00000500);
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_inv(fe_t output,
                                                            const fe_t t1) {
    int i;
    /* temporary variables */
    fe_t acc, t23, t25;

    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(acc, t1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t25, t1, acc);
    for (i = 0; i < 9; i++)
        fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t25, t25, acc);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t23, t25, acc);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t25, t23, acc);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(acc, t1);
    for (i = 0; i < 247; i++)
        fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(acc, acc, t25);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(output, acc, t23);
}